

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftIm<(moira::Core)1,(moira::Instr)96,(moira::Mode)11,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint local_34;
  int cyc;
  int cnt;
  int dst;
  int src;
  u16 opcode_local;
  Moira *this_local;
  
  local_34 = (int)(uint)opcode >> 9 & 7;
  if (local_34 == 0) {
    local_34 = 8;
  }
  prefetch<(moira::Core)1,4ull>(this);
  uVar1 = readD<4>(this,opcode & 7);
  uVar1 = shift<(moira::Core)1,(moira::Instr)96,4>(this,local_34,(ulong)uVar1);
  writeD<4>(this,opcode & 7,uVar1);
  (*this->_vptr_Moira[2])(this,(ulong)(local_34 * 2 + 8));
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::LSL:
            case Instr::LSR:
                
                CYCLES(4);
                break;
                
            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(8);
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES(12);
                break;
                
            default:
                
                CYCLES(6);
                break;
        }
    }

    FINALIZE
}